

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_add_text(LodePNGInfo *info,char *key,char *str)

{
  char *in;
  void *pvVar1;
  char **in_RDX;
  long in_RDI;
  char **new_strings;
  char **new_keys;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  in = (char *)lodepng_realloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pvVar1 = lodepng_realloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if ((in == (char *)0x0) || (pvVar1 == (void *)0x0)) {
    lodepng_free((void *)0x1199c5);
    lodepng_free((void *)0x1199cf);
    local_4 = 0x53;
  }
  else {
    *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
    *(char **)(in_RDI + 0x50) = in;
    *(void **)(in_RDI + 0x58) = pvVar1;
    string_init((char **)0x119a2b);
    string_set(in_RDX,in);
    string_init((char **)0x119a74);
    string_set(in_RDX,in);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned lodepng_add_text(LodePNGInfo* info, const char* key, const char* str)
{
	char** new_keys = (char**)(lodepng_realloc(info->text_keys, sizeof(char*) * (info->text_num + 1)));
	char** new_strings = (char**)(lodepng_realloc(info->text_strings, sizeof(char*) * (info->text_num + 1)));
	if (!new_keys || !new_strings)
	{
		lodepng_free(new_keys);
		lodepng_free(new_strings);
		return 83; /*alloc fail*/
	}

	++info->text_num;
	info->text_keys = new_keys;
	info->text_strings = new_strings;

	string_init(&info->text_keys[info->text_num - 1]);
	string_set(&info->text_keys[info->text_num - 1], key);

	string_init(&info->text_strings[info->text_num - 1]);
	string_set(&info->text_strings[info->text_num - 1], str);

	return 0;
}